

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkyc(fitsfile *fptr,char *keyname,float *value,int decim,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char local_188 [8];
  char card [81];
  char local_128 [8];
  char oldcomm [73];
  char tmpstring [71];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  int decim_local;
  float *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x10000255 = status;
    iVar1 = ffgkey(fptr,keyname,local_88,local_128,status);
    if (iVar1 < 1) {
      strcpy(local_88,"(");
      ffr2e(*value,decim,oldcomm + 0x48,stack0xffffffffffffffc0);
      sVar2 = strlen(oldcomm + 0x48);
      if (sVar2 + 3 < 0x47) {
        strcat(local_88,oldcomm + 0x48);
        strcat(local_88,", ");
        ffr2e(value[1],decim,oldcomm + 0x48,stack0xffffffffffffffc0);
        sVar2 = strlen(local_88);
        sVar3 = strlen(oldcomm + 0x48);
        if (sVar2 + sVar3 + 1 < 0x47) {
          strcat(local_88,oldcomm + 0x48);
          strcat(local_88,")");
          if ((comm == (char *)0x0) || (*comm == '&')) {
            ffmkky(keyname,local_88,local_128,local_188,stack0xffffffffffffffc0);
          }
          else {
            ffmkky(keyname,local_88,comm,local_188,stack0xffffffffffffffc0);
          }
          ffmkey(fptr,local_188,stack0xffffffffffffffc0);
          fptr_local._4_4_ = *stack0xffffffffffffffc0;
        }
        else {
          ffpmsg("complex key value too long (ffmkyc)");
          *stack0xffffffffffffffc0 = 0x192;
          fptr_local._4_4_ = 0x192;
        }
      }
      else {
        ffpmsg("complex key value too long (ffmkyc)");
        *stack0xffffffffffffffc0 = 0x192;
        fptr_local._4_4_ = 0x192;
      }
    }
    else {
      fptr_local._4_4_ = *stack0xffffffffffffffc0;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffmkyc(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           float *value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    strcpy(valstring, "(" );
    ffr2e(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkyc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffr2e(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkyc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}